

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

Expr exec_eval(pExecutor exec,pContext context,Expr expr)

{
  anon_union_8_8_707b72ea_for_Expr_1 aVar1;
  _Bool _Var2;
  int iVar3;
  Expr *__ptr;
  anon_union_8_8_707b72ea_for_Expr_1 key;
  ValueType VVar4;
  Expr EVar5;
  Expr EVar6;
  Expr expr_00;
  Expr expr_01;
  int len;
  int local_34;
  Expr local_30;
  
  key = expr.field_1;
  VVar4 = expr.type;
  if (VVar4 == VT_PAIR) {
    expr_01.field_1.val_atom = key.val_atom;
    expr_01._0_8_ = 2;
    __ptr = get_list(exec,expr_01,&local_34);
    EVar5._4_4_ = 0;
    EVar5.type = __ptr->type;
    EVar5.field_1.val_atom = (__ptr->field_1).val_atom;
    EVar5 = get_function(exec,context,EVar5);
    expr_00._4_4_ = 0;
    expr_00.type = EVar5.type;
    expr_00.field_1.val_atom = EVar5.field_1.val_atom;
    _Var2 = is_none(expr_00);
    if (_Var2) {
      puts("eval: list head not a function or registered macro");
      goto LAB_00107f7d;
    }
    EVar5 = exec_function(exec,context,EVar5.field_1.val_func,__ptr + 1,local_34 + -1);
    local_30.field_1 = EVar5.field_1;
    local_30.type = EVar5.type;
    free(__ptr);
    VVar4 = local_30.type;
    aVar1 = local_30.field_1;
  }
  else {
    aVar1.val_atom = key.val_atom;
    if ((VVar4 == VT_ATOM) &&
       (iVar3 = context_get(context,key.val_atom,&local_30), VVar4 = local_30.type,
       aVar1 = local_30.field_1, iVar3 == -1)) {
      printf("eval: atom \"%s\" not binded\n",exec->atoms[key.val_atom]);
LAB_00107f7d:
      exit(1);
    }
  }
  local_30.field_1 = aVar1;
  local_30.type = VVar4;
  EVar6._4_4_ = 0;
  EVar6.type = local_30.type;
  EVar6.field_1.val_atom = local_30.field_1.val_atom;
  return EVar6;
}

Assistant:

Expr exec_eval(pExecutor exec, pContext context, Expr expr)
{
    if (expr.type == VT_ATOM)
    {
        Expr value;
        if (context_get(context, expr.val_atom, &value) == MAP_FAILED)
        {
            logf("eval: atom \"%s\" not binded", exec->atoms[expr.val_atom]);
            exit(1);
        }
        return value;
    }
    else if (expr.type != VT_PAIR)
    {
        return expr;
    }

    int len;
    Expr *list = get_list(exec, expr, &len);

    Expr func = get_function(exec, context, list[0]);
    if (is_none(func))
    {
        log("eval: list head not a function or registered macro");
        // TODO: print debug information
        exit(1);
    }
    Expr result = exec_function(exec, context, func.val_func, list + 1, len - 1);
    free(list);
    return result;
}